

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::render
          (QGraphicsScene *this,QPainter *painter,QRectF *target,QRectF *source,
          AspectRatioMode aspectRatioMode)

{
  undefined8 uVar1;
  long lVar2;
  QGraphicsItemPrivate *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  qsizetype qVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  void *pvVar10;
  QGraphicsItem **ppQVar11;
  QTransform *pQVar12;
  QStyleOptionGraphicsItem *pQVar13;
  long lVar14;
  undefined1 *puVar15;
  long lVar16;
  QStyleOptionGraphicsItem *pQVar17;
  qsizetype i;
  qreal *pqVar18;
  undefined8 *puVar19;
  QRect *pQVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  byte bVar22;
  double dVar23;
  double dVar25;
  undefined1 auVar24 [16];
  undefined1 local_178 [12];
  undefined4 uStack_16c;
  QRegion local_140;
  QArrayDataPointer<QGraphicsItem_*> local_138;
  undefined1 local_118 [24];
  double dStack_100;
  QRectF local_f8;
  QRect local_d8 [4];
  undefined2 local_90;
  QTransform painterTransform;
  
  bVar22 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.xp = source->xp;
  local_f8.yp = source->yp;
  local_f8.w = source->w;
  local_f8.h = source->h;
  if ((((local_f8.w == 0.0) && (!NAN(local_f8.w))) && (local_f8.h == 0.0)) && (!NAN(local_f8.h))) {
    sceneRect(&local_f8,this);
  }
  local_118._0_8_ = target->xp;
  local_118._8_8_ = target->yp;
  local_118._16_8_ = target->w;
  dStack_100 = target->h;
  if (((target->w == 0.0) && (!NAN(target->w))) && ((target->h == 0.0 && (!NAN(target->h))))) {
    plVar9 = (long *)QPainter::device();
    iVar7 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (iVar7 == 5) {
      dStack_100 = local_f8.h;
      local_118._16_8_ = local_f8.w;
      local_118._0_8_ = local_f8.xp;
      local_118._8_8_ = local_f8.yp;
    }
    else {
      plVar9 = (long *)QPainter::device();
      iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9,1);
      plVar9 = (long *)QPainter::device();
      iVar8 = (**(code **)(*plVar9 + 0x20))(plVar9,2);
      local_118._16_8_ = (undefined8)iVar7;
      dStack_100 = (double)iVar8;
      local_118._0_8_ = 0.0;
      local_118._8_8_ = 0.0;
    }
  }
  auVar5._8_8_ = local_f8.h;
  auVar5._0_8_ = local_f8.w;
  _local_178 = divpd(stack0xfffffffffffffef8,auVar5);
  dVar23 = local_178._0_8_;
  dVar25 = local_178._8_8_;
  if (aspectRatioMode == KeepAspectRatioByExpanding) {
    unique0x1000093e = dVar25;
    if (dVar25 <= dVar23) {
      unique0x10000946 = dVar23;
    }
    local_178._0_8_ = register0x00001200;
  }
  else {
    if (aspectRatioMode == KeepAspectRatio) {
      if (dVar25 <= dVar23) {
        dVar23 = dVar25;
      }
      register0x00001288 = dVar23;
      local_178._0_8_ = dVar23;
    }
    dVar25 = local_178._8_8_;
  }
  local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  pqVar18 = (qreal *)&DAT_00679578;
  pQVar12 = &painterTransform;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    pQVar12->m_matrix[0][0] = *pqVar18;
    pqVar18 = pqVar18 + (ulong)bVar22 * -2 + 1;
    pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
  }
  painterTransform._72_2_ = 0;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x70))
            (&local_138,*(long **)(*(long *)(this + 8) + 0x88),&local_f8,3,1);
  qVar6 = local_138.size;
  pvVar10 = operator_new__(local_138.size * 8);
  ppQVar11 = local_138.ptr;
  puVar15 = (undefined1 *)qVar6;
  while (puVar15 = puVar15 + -1, puVar15 != (undefined1 *)0xffffffffffffffff) {
    *(QGraphicsItem **)((long)pvVar10 + (long)puVar15 * 8) = *ppQVar11;
    ppQVar11 = ppQVar11 + 1;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = qVar6;
  uVar21 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x60),8) == 0) {
    uVar21 = SUB168(auVar3 * ZEXT816(0x60),0) | 8;
  }
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)&local_138);
  QPainter::save();
  QPainter::setClipRect((QRectF *)painter,(ClipOperation)local_118);
  pqVar18 = (qreal *)&DAT_006795c0;
  pQVar12 = &painterTransform;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    pQVar12->m_matrix[0][0] = *pqVar18;
    pqVar18 = pqVar18 + (ulong)bVar22 * -2 + 1;
    pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
  }
  lVar14 = 9;
  pqVar18 = (qreal *)&DAT_00679578;
  pQVar12 = &painterTransform;
  for (lVar16 = lVar14; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar12->m_matrix[0][0] = *pqVar18;
    pqVar18 = pqVar18 + (ulong)bVar22 * -2 + 1;
    pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
  }
  painterTransform._72_2_ = 0xa800;
  puVar19 = &DAT_00679578;
  pQVar20 = local_d8;
  for (; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar1 = *puVar19;
    pQVar20->x1 = (Representation)(int)uVar1;
    pQVar20->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
    puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
    pQVar20 = (QRect *)&pQVar20[-(ulong)bVar22].x2;
  }
  auVar4._4_8_ = dVar25;
  auVar4._0_4_ = local_178._4_4_;
  auVar24._0_8_ = auVar4._0_8_ << 0x20;
  auVar24._8_4_ = local_178._8_4_;
  auVar24._12_4_ = uStack_16c;
  local_90 = 0;
  QTransform::translate((double)local_118._0_8_,(double)local_118._8_8_);
  QTransform::scale((double)local_178._0_8_,auVar24._8_8_);
  pQVar12 = (QTransform *)QTransform::translate(-local_f8.xp,-local_f8.yp);
  QTransform::operator*=(&painterTransform,pQVar12);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&painterTransform,0));
  plVar9 = (long *)operator_new__(uVar21);
  *plVar9 = qVar6;
  pQVar13 = (QStyleOptionGraphicsItem *)(plVar9 + 1);
  if ((undefined1 *)qVar6 != (undefined1 *)0x0) {
    lVar14 = qVar6 * 0x60;
    pQVar17 = pQVar13;
    do {
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(pQVar17);
      pQVar17 = pQVar17 + 1;
      lVar14 = lVar14 + -0x60;
    } while (lVar14 != 0);
  }
  pQVar17 = pQVar13;
  for (puVar15 = (undefined1 *)0x0; (undefined1 *)qVar6 != puVar15; puVar15 = puVar15 + 1) {
    this_00 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar10 + (long)puVar15 * 8) + 8);
    local_d8[0] = QRectF::toRect((QRectF *)local_118);
    QRegion::QRegion(&local_140,local_d8,Rectangle);
    QGraphicsItemPrivate::initStyleOption(this_00,pQVar17,&painterTransform,&local_140,false);
    QRegion::~QRegion(&local_140);
    pQVar17 = pQVar17 + 1;
  }
  (**(code **)(*(long *)this + 0xe8))(this,painter,&local_f8);
  (**(code **)(*(long *)this + 0xf8))(this,painter,qVar6,pvVar10,pQVar13,0);
  (**(code **)(*(long *)this + 0xf0))(this,painter,&local_f8);
  operator_delete__(pvVar10);
  lVar14 = *plVar9 * 0x60;
  uVar21 = lVar14 + 8;
  lVar16 = *plVar9;
  while (lVar16 != 0) {
    QStyleOption::~QStyleOption((QStyleOption *)((long)plVar9 + lVar14 + -0x58));
    lVar14 = lVar14 + -0x60;
    lVar16 = lVar14;
  }
  operator_delete__(plVar9,uVar21);
  QPainter::restore();
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::render(QPainter *painter, const QRectF &target, const QRectF &source,
                            Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    // Default source rect = scene rect
    QRectF sourceRect = source;
    if (sourceRect.isNull())
        sourceRect = sceneRect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (targetRect.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QList<QGraphicsItem *> itemList = items(sourceRect, Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    const qsizetype numItems = itemList.size();
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    painter->save();

    // Transform the painter.
    painter->setClipRect(targetRect, Qt::IntersectClip);
    QTransform painterTransform;
    painterTransform *= QTransform()
                        .translate(targetRect.left(), targetRect.top())
                        .scale(xratio, yratio)
                        .translate(-sourceRect.left(), -sourceRect.top());
    painter->setWorldTransform(painterTransform, true);

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = new QStyleOptionGraphicsItem[numItems];
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterTransform, targetRect.toRect());

    // Render the scene.
    drawBackground(painter, sourceRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceRect);

    delete [] itemArray;
    delete [] styleOptionArray;

    painter->restore();
}